

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O1

golf_transform_t *
golf_entity_get_world_transform
          (golf_transform_t *__return_storage_ptr__,golf_level_t *level,golf_entity_t *entity)

{
  float fVar1;
  float fVar2;
  float fVar3;
  golf_entity_t *pgVar4;
  mat4 m;
  anon_union_1216_8_ffe1ccc7_for_golf_entity_4 *paVar5;
  long lVar6;
  vec3 *pvVar7;
  float fVar8;
  vec3 vVar12;
  vec3 v1;
  quat qVar13;
  quat q;
  float local_d4;
  float local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  float local_68;
  float fStack_64;
  mat4 local_58;
  float fVar9;
  float fVar10;
  float fVar11;
  
  vVar12 = vec3_create(0.0,0.0,0.0);
  local_d0 = vVar12.z;
  local_b8 = vVar12._0_8_;
  vVar12 = vec3_create(1.0,1.0,1.0);
  local_d4 = vVar12.z;
  local_c8 = vVar12._0_8_;
  qVar13 = quat_create(0.0,0.0,0.0,1.0);
  fVar10 = qVar13.z;
  fVar11 = qVar13.w;
  fVar8 = qVar13.x;
  fVar9 = qVar13.y;
  lVar6 = (long)entity->parent_idx;
  if (-1 < lVar6) {
    pgVar4 = (level->entities).data;
    switch(pgVar4[lVar6].type) {
    case MODEL_ENTITY:
    case BALL_START_ENTITY:
    case HOLE_ENTITY:
    case GROUP_ENTITY:
    case BEGIN_ANIMATION_ENTITY:
      paVar5 = &pgVar4[lVar6].field_4;
      break;
    case GEO_ENTITY:
    case WATER_ENTITY:
      paVar5 = (anon_union_1216_8_ffe1ccc7_for_golf_entity_4 *)&pgVar4[lVar6].field_4.geo.transform;
      break;
    case CAMERA_ZONE_ENTITY:
      paVar5 = (anon_union_1216_8_ffe1ccc7_for_golf_entity_4 *)
               &pgVar4[lVar6].field_4.model.transform.position.y;
      break;
    default:
      paVar5 = (anon_union_1216_8_ffe1ccc7_for_golf_entity_4 *)0x0;
    }
    if (paVar5 != (anon_union_1216_8_ffe1ccc7_for_golf_entity_4 *)0x0) {
      local_b8 = *(undefined8 *)paVar5;
      local_d0 = *(float *)((long)paVar5 + 8);
      fVar8 = (float)*(undefined8 *)((long)paVar5 + 0xc);
      fVar9 = (float)((ulong)*(undefined8 *)((long)paVar5 + 0xc) >> 0x20);
      fVar10 = (float)*(undefined8 *)((long)paVar5 + 0x14);
      fVar11 = (float)((ulong)*(undefined8 *)((long)paVar5 + 0x14) >> 0x20);
      local_c8 = *(undefined8 *)((long)paVar5 + 0x1c);
      local_d4 = (paVar5->model).transform.scale.z;
    }
  }
  switch(entity->type) {
  case MODEL_ENTITY:
  case BALL_START_ENTITY:
  case HOLE_ENTITY:
  case GROUP_ENTITY:
  case BEGIN_ANIMATION_ENTITY:
    pvVar7 = (vec3 *)&entity->field_4;
    break;
  case GEO_ENTITY:
  case WATER_ENTITY:
    pvVar7 = &(entity->field_4).geo.transform.position;
    break;
  case CAMERA_ZONE_ENTITY:
    pvVar7 = (vec3 *)&(entity->field_4).model.transform.position.y;
    break;
  default:
    pvVar7 = (vec3 *)0x0;
  }
  if (pvVar7 == (vec3 *)0x0) {
    golf_log_warning("Attempting to get world transform on entity with no transform");
    (__return_storage_ptr__->position).x = (float)(undefined4)local_b8;
    (__return_storage_ptr__->position).y = (float)local_b8._4_4_;
    (__return_storage_ptr__->position).z = local_d0;
    (__return_storage_ptr__->rotation).x = fVar8;
    (__return_storage_ptr__->rotation).y = fVar9;
    (__return_storage_ptr__->rotation).z = fVar10;
    (__return_storage_ptr__->rotation).w = fVar11;
    (__return_storage_ptr__->scale).x = (float)local_c8;
    (__return_storage_ptr__->scale).y = local_c8._4_4_;
    (__return_storage_ptr__->scale).z = local_d4;
  }
  else {
    qVar13.y = fVar9;
    qVar13.x = fVar8;
    qVar13.w = fVar11;
    qVar13.z = fVar10;
    qVar13 = quat_multiply(qVar13,*(quat *)(pvVar7 + 1));
    fVar1 = pvVar7[2].y;
    fVar2 = pvVar7[2].z;
    fVar3 = pvVar7[3].x;
    q.y = fVar9;
    q.x = fVar8;
    q.w = fVar11;
    q.z = fVar10;
    mat4_from_quat(&local_58,q);
    m.m[2] = local_58.m[2];
    m.m[3] = local_58.m[3];
    m.m[0] = local_58.m[0];
    m.m[1] = local_58.m[1];
    m.m[4] = local_58.m[4];
    m.m[5] = local_58.m[5];
    m.m[6] = local_58.m[6];
    m.m[7] = local_58.m[7];
    m.m[8] = local_58.m[8];
    m.m[9] = local_58.m[9];
    m.m[10] = local_58.m[10];
    m.m[0xb] = local_58.m[0xb];
    m.m[0xc] = local_58.m[0xc];
    m.m[0xd] = local_58.m[0xd];
    m.m[0xe] = local_58.m[0xe];
    m.m[0xf] = local_58.m[0xf];
    vVar12 = vec3_apply_mat4(*pvVar7,1.0,m);
    v1.x = vVar12.x * (float)local_c8;
    v1.y = vVar12.y * local_c8._4_4_;
    v1.z = vVar12.z * local_d4;
    vVar12.z = local_d0;
    vVar12.x = (float)(undefined4)local_b8;
    vVar12.y = (float)local_b8._4_4_;
    vVar12 = vec3_add(v1,vVar12);
    (__return_storage_ptr__->position).x = (float)(int)vVar12._0_8_;
    (__return_storage_ptr__->position).y = (float)(int)((ulong)vVar12._0_8_ >> 0x20);
    (__return_storage_ptr__->position).z = vVar12.z;
    (__return_storage_ptr__->scale).x = fVar1 * (float)local_c8;
    (__return_storage_ptr__->scale).y = local_c8._4_4_ * fVar2;
    (__return_storage_ptr__->scale).z = fVar3 * local_d4;
    local_68 = qVar13.x;
    fStack_64 = qVar13.y;
    (__return_storage_ptr__->rotation).x = local_68;
    (__return_storage_ptr__->rotation).y = fStack_64;
    (__return_storage_ptr__->rotation).z = qVar13.z;
    (__return_storage_ptr__->rotation).w = qVar13.w;
  }
  return __return_storage_ptr__;
}

Assistant:

golf_transform_t golf_entity_get_world_transform(golf_level_t *level, golf_entity_t *entity) {
    golf_transform_t parent_transform = golf_transform(V3(0, 0, 0), V3(1, 1, 1), QUAT(0, 0, 0, 1));
    if (entity->parent_idx >= 0) {
        golf_entity_t *parent_entity = &level->entities.data[entity->parent_idx];
        golf_transform_t *transform = golf_entity_get_transform(parent_entity);
        if (transform) {
            parent_transform = *transform;
        }
    }

    golf_transform_t *transform = golf_entity_get_transform(entity);
    if (!transform) {
        golf_log_warning("Attempting to get world transform on entity with no transform");
        return parent_transform;
    }

    quat rotation = quat_multiply(parent_transform.rotation, transform->rotation);

    vec3 scale = parent_transform.scale;
    scale.x *= transform->scale.x;
    scale.y *= transform->scale.y;
    scale.z *= transform->scale.z;

    vec3 position = vec3_apply_mat4(transform->position, 1, mat4_from_quat(parent_transform.rotation));
    position.x *= parent_transform.scale.x;
    position.y *= parent_transform.scale.y;
    position.z *= parent_transform.scale.z;
    position = vec3_add(position, parent_transform.position);

    return golf_transform(position, scale, rotation);
}